

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_spatial_array.h
# Opt level: O1

void __thiscall
embree::sse2::
HeuristicArraySpatialSAH<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/common/rtcore_builder.cpp:317:9),_embree::PrimRef,_32UL,_16UL>
::create_spatial_splits
          (HeuristicArraySpatialSAH<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:317:9),_embree::PrimRef,_32UL,_16UL>
           *this,PrimInfoExtRange *set,SpatialSplit *split,SpatialBinMapping<16UL> *mapping)

{
  unsigned_long *puVar1;
  _func_int **pp_Var2;
  _func_int **pp_Var3;
  char cVar4;
  int iVar5;
  task *ptVar6;
  runtime_error *this_00;
  float fVar7;
  atomic<unsigned_long> ext_elements;
  size_t max_ext_range_size;
  size_t ext_range_start;
  small_object_allocator alloc;
  float fpos;
  task_group_context context;
  ulong local_118;
  ulong local_110;
  unsigned_long local_108;
  small_object_pool *local_100;
  float local_f4;
  HeuristicArraySpatialSAH<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_common_rtcore_builder_cpp:317:9),_embree::PrimRef,_32UL,_16UL>
  *local_f0;
  SpatialSplit *local_e8;
  float *local_e0;
  undefined1 *local_d8;
  ulong *local_d0;
  unsigned_long *local_c8;
  undefined8 local_c0;
  undefined4 local_b8;
  wait_context local_b0;
  task_group_context local_a0;
  
  local_d8 = (undefined1 *)&local_118;
  local_108 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._end;
  local_110 = (set->super_extended_range<unsigned_long>)._ext_end - local_108;
  LOCK();
  local_118 = 0;
  UNLOCK();
  iVar5 = split->pos;
  if ((long)iVar5 < 0) {
    fVar7 = (float)(ulong)(long)iVar5;
  }
  else {
    fVar7 = (float)iVar5;
  }
  local_f4 = fVar7 * (split->mapping).inv_scale.field_0.v[split->dim] +
             (split->mapping).ofs.field_0.v[split->dim];
  local_e0 = &local_f4;
  pp_Var2 = (_func_int **)
            (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin;
  pp_Var3 = (_func_int **)(set->super_extended_range<unsigned_long>).super_range<unsigned_long>._end
  ;
  local_d0 = &local_110;
  local_c8 = &local_108;
  local_a0.my_version = proxy_support;
  local_a0.my_traits = (context_traits)0x4;
  local_a0.my_node.my_prev_node = (intrusive_list_node *)0x0;
  local_a0.my_node.my_next_node = (intrusive_list_node *)0x0;
  local_a0.my_name = CUSTOM_CTX;
  local_f0 = this;
  local_e8 = split;
  tbb::detail::r1::initialize(&local_a0);
  if (pp_Var2 < pp_Var3) {
    local_100 = (small_object_pool *)0x0;
    ptVar6 = (task *)tbb::detail::r1::allocate(&local_100,0x80);
    ptVar6->m_reserved[3] = 0;
    ptVar6->m_reserved[4] = 0;
    ptVar6->m_reserved[1] = 0;
    ptVar6->m_reserved[2] = 0;
    (ptVar6->super_task_traits).m_version_and_traits = 0;
    ptVar6->m_reserved[0] = 0;
    ptVar6->m_reserved[5] = 0;
    ptVar6->_vptr_task = (_func_int **)&PTR__task_022023d8;
    ptVar6[1]._vptr_task = pp_Var3;
    ptVar6[1].super_task_traits.m_version_and_traits = (uint64_t)pp_Var2;
    ptVar6[1].m_reserved[0] = 0x40;
    ptVar6[1].m_reserved[1] = (uint64_t)&local_f0;
    iVar5 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
    *(undefined4 *)(ptVar6[1].m_reserved + 4) = 0;
    *(undefined1 *)((long)ptVar6[1].m_reserved + 0x24) = 5;
    ptVar6[1].m_reserved[3] = ((long)iVar5 & 0x3fffffffffffffffU) * 2;
    ptVar6[1].m_reserved[5] = (uint64_t)local_100;
    local_c0 = 0;
    local_b8 = 1;
    local_b0.m_version_and_traits = 1;
    local_b0.m_ref_count.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)1;
    ptVar6[1].m_reserved[2] = (uint64_t)&local_c0;
    tbb::detail::r1::execute_and_wait(ptVar6,&local_a0,&local_b0,&local_a0);
  }
  cVar4 = tbb::detail::r1::is_group_execution_cancelled(&local_a0);
  if (cVar4 == '\0') {
    tbb::detail::r1::destroy(&local_a0);
    if (local_110 < local_118) {
      local_118 = local_110;
    }
    puVar1 = &(set->super_extended_range<unsigned_long>).super_range<unsigned_long>._end;
    *puVar1 = *puVar1 + local_118;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"task cancelled");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

__noinline void create_spatial_splits(PrimInfoExtRange& set, const SpatialSplit& split, const SpatialBinMapping<SPATIAL_BINS> &mapping)
        {
          assert(set.has_ext_range());
          const size_t max_ext_range_size = set.ext_range_size();
          const size_t ext_range_start = set.end();

          /* atomic counter for number of primref splits */
          std::atomic<size_t> ext_elements;
          ext_elements.store(0);
          
          const float fpos = split.mapping.pos(split.pos,split.dim);
        
          const unsigned int mask = 0xFFFFFFFF >> RESERVED_NUM_SPATIAL_SPLITS_GEOMID_BITS;

          parallel_for( set.begin(), set.end(), CREATE_SPLITS_STEP_SIZE, [&](const range<size_t>& r) {
              for (size_t i=r.begin();i<r.end();i++)
              {
                const unsigned int splits = prims0[i].geomID() >> (32-RESERVED_NUM_SPATIAL_SPLITS_GEOMID_BITS);

                if (likely(splits <= 1)) continue; /* todo: does this ever happen ? */

                const int bin0 = split.mapping.bin(prims0[i].lower)[split.dim];
                const int bin1 = split.mapping.bin(prims0[i].upper)[split.dim];
                if (unlikely(bin0 < split.pos && bin1 >= split.pos))
                {
                  assert(splits > 1);

                  PrimRef left,right;
                  const auto splitter = splitterFactory(prims0[i]);
                  splitter(prims0[i],split.dim,fpos,left,right);
                
                  // no empty splits
                  if (unlikely(left.bounds().empty() || right.bounds().empty())) continue;
                
                  left.lower.u  = (left.lower.u  & mask) | ((splits-1) << (32-RESERVED_NUM_SPATIAL_SPLITS_GEOMID_BITS));
                  right.lower.u = (right.lower.u & mask) | ((splits-1) << (32-RESERVED_NUM_SPATIAL_SPLITS_GEOMID_BITS));

                  const size_t ID = ext_elements.fetch_add(1);

                  /* break if the number of subdivided elements are greater than the maximum allowed size */
                  if (unlikely(ID >= max_ext_range_size)) 
                    break;

                  /* only write within the correct bounds */
                  assert(ID < max_ext_range_size);
                  prims0[i] = left;
                  prims0[ext_range_start+ID] = right;     
                }
              }
            });

          const size_t numExtElements = min(max_ext_range_size,ext_elements.load());          
          assert(set.end()+numExtElements<=set.ext_end());
          set._end += numExtElements;
        }